

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O1

size_t u32CTZ_fast(u32 w)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  uVar3 = w << 0x10;
  uVar4 = uVar3;
  if (uVar3 == 0) {
    uVar4 = w;
  }
  uVar1 = (ulong)(uVar3 == 0) * 0x10;
  uVar2 = uVar1 | 8;
  uVar3 = uVar4 << 8;
  if ((uVar4 & 0xffffff) == 0) {
    uVar2 = uVar1 + 0x10;
    uVar3 = uVar4;
  }
  bVar6 = (uVar3 & 0xfffffff) == 0;
  uVar4 = uVar3 << 4;
  if (bVar6) {
    uVar4 = uVar3;
  }
  uVar1 = uVar2 - 4;
  if (bVar6) {
    uVar1 = uVar2;
  }
  uVar3 = uVar4 * 4;
  uVar2 = uVar1 - 2;
  if (uVar3 == 0) {
    uVar2 = uVar1;
    uVar3 = uVar4;
  }
  iVar5 = -2;
  if ((uVar3 & 0x7ffffffc) == 0) {
    iVar5 = (int)uVar3 >> 0x1f;
  }
  return (long)iVar5 + uVar2;
}

Assistant:

size_t FAST(u32CTZ)(register u32 w)
{
	register size_t l = 32;
	register u32 t;
	// дихотомия
	if (t = w << 16)
		l -= 16, w = t;
	if (t = w << 8)
		l -= 8, w = t;
	if (t = w << 4)
		l -= 4, w = t;
	if (t = w << 2)
		l -= 2, w = t;
	// возврат
	t = 0;
	return ((u32)(w << 1)) ? l - 2 : l - (w ? 1 : 0);
}